

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TokenMap.cpp
# Opt level: O1

void __thiscall OpenMD::TokenMap::TokenMap(TokenMap *this)

{
  _Rb_tree_header *p_Var1;
  any *paVar2;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar3;
  _Arg __arg;
  any local_b0;
  ulong *local_a0;
  undefined8 local_98;
  ulong local_90;
  undefined1 uStack_88;
  undefined1 uStack_87;
  undefined6 uStack_86;
  Token local_80;
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  local_68;
  _Arg local_30;
  
  p_Var1 = &(this->tokenMap_)._M_t._M_impl.super__Rb_tree_header;
  (this->tokenMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_color = _S_red;
  (this->tokenMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_parent = (_Base_ptr)0x0;
  (this->tokenMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_left = &p_Var1->_M_header;
  (this->tokenMap_)._M_t._M_impl.super__Rb_tree_header._M_header._M_right = &p_Var1->_M_header;
  (this->tokenMap_)._M_t._M_impl.super__Rb_tree_header._M_node_count = 0;
  local_98 = 6;
  local_90 = CONCAT17(local_90._7_1_,0x656e69666564);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 6;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  paVar2 = &local_80.value;
  local_80.tok = 0x301;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[7],_OpenMD::Token,_true>(&local_68,(char (*) [7])0x2a8160,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  paVar3 = &local_68.first.field_2;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 6;
  local_90 = CONCAT17(local_90._7_1_,0x7463656c6573);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 6;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x302;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[7],_OpenMD::Token,_true>(&local_68,(char (*) [7])"select",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = CONCAT62(local_90._2_6_,0x28);
  local_98 = 1;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 1;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x400;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_68,(char (*) [2])0x2a1b66,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = CONCAT62(local_90._2_6_,0x29);
  local_98 = 1;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 1;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x401;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_68,(char (*) [2])0x2a19ac,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = CONCAT44(local_90._4_4_,0x646e61);
  local_98 = 3;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 3;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x403;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[4],_OpenMD::Token,_true>(&local_68,(char (*) [4])"and",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = CONCAT44(local_90._4_4_,0x646e61);
  local_98 = 3;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 3;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x403;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_68,(char (*) [2])0x2ad054,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = CONCAT44(local_90._4_4_,0x646e61);
  local_98 = 3;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 3;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x403;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_68,(char (*) [3])"&&",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 2;
  local_90 = CONCAT53(local_90._3_5_,0x726f);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 2;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x404;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_68,(char (*) [3])0x29d768,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 2;
  local_90 = CONCAT53(local_90._3_5_,0x726f);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 2;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x404;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_68,(char (*) [2])0x29e532,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 2;
  local_90 = CONCAT53(local_90._3_5_,0x726f);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 2;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x404;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_68,(char (*) [2])0x2ad057,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 2;
  local_90 = CONCAT53(local_90._3_5_,0x726f);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 2;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x404;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_68,(char (*) [3])"||",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = CONCAT44(local_90._4_4_,0x746f6e);
  local_98 = 3;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 3;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x405;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[4],_OpenMD::Token,_true>(&local_68,(char (*) [4])"not",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = CONCAT44(local_90._4_4_,0x746f6e);
  local_98 = 3;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 3;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x405;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_68,(char (*) [2])0x29c7e6,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = CONCAT62(local_90._2_6_,0x3c);
  local_98 = 1;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 1;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x3403;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_68,(char (*) [2])0x2a19f8,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 2;
  local_90 = CONCAT53(local_90._3_5_,0x3d3c);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 2;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x3402;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_68,(char (*) [3])"<=",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 2;
  local_90 = CONCAT53(local_90._3_5_,0x3d3e);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 2;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x3401;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_68,(char (*) [3])">=",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = CONCAT62(local_90._2_6_,0x3e);
  local_98 = 1;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 1;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x3400;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_68,(char (*) [2])0x2a0dd2,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 2;
  local_90 = CONCAT53(local_90._3_5_,0x3d3d);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 2;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x3404;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_68,(char (*) [3])0x2a1d35,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 2;
  local_90 = CONCAT53(local_90._3_5_,0x3d21);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 2;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x3405;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_68,(char (*) [3])"!=",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 6;
  local_90 = CONCAT17(local_90._7_1_,0x6e6968746977);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 6;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x1406;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[7],_OpenMD::Token,_true>(&local_68,(char (*) [7])"within",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = CONCAT62(local_90._2_6_,0x2e);
  local_98 = 1;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 1;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x408;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_68,(char (*) [2])0x29d128,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 4;
  local_90 = CONCAT35(local_90._5_3_,0x7373616d);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 4;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x1c00;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[5],_OpenMD::Token,_true>(&local_68,(char (*) [5])"mass",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 6;
  local_90 = CONCAT17(local_90._7_1_,0x656772616863);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 6;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x1c01;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[7],_OpenMD::Token,_true>(&local_68,(char (*) [7])"charge",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 4;
  local_90 = CONCAT35(local_90._5_3_,0x6c6c7568);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 4;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x140c;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[5],_OpenMD::Token,_true>(&local_68,(char (*) [5])0x2ad868,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = 0x6c75686168706c61;
  uStack_88 = 0x6c;
  uStack_87 = 0;
  local_98 = 9;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 9;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x140d;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[10],_OpenMD::Token,_true>(&local_68,(char (*) [10])"alphahull",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = CONCAT62(local_90._2_6_,0x78);
  local_98 = 1;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 1;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x1c02;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_68,(char (*) [2])0x2a1d7a,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = CONCAT62(local_90._2_6_,0x79);
  local_98 = 1;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 1;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x1c03;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_68,(char (*) [2])0x2aad43,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = CONCAT62(local_90._2_6_,0x7a);
  local_98 = 1;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 1;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x1c04;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_68,(char (*) [2])0x2aad49,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = 0x7864657070617277;
  local_98 = 8;
  uStack_88 = 0;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 8;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x1c06;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[9],_OpenMD::Token,_true>(&local_68,(char (*) [9])"wrappedx",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = 0x7964657070617277;
  local_98 = 8;
  uStack_88 = 0;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 8;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x1c07;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[9],_OpenMD::Token,_true>(&local_68,(char (*) [9])"wrappedy",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = 0x7a64657070617277;
  local_98 = 8;
  uStack_88 = 0;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 8;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x1c08;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[9],_OpenMD::Token,_true>(&local_68,(char (*) [9])"wrappedz",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 6;
  local_90 = CONCAT17(local_90._7_1_,0x6f6e6d6f7461);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 6;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x1c09;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[7],_OpenMD::Token,_true>(&local_68,(char (*) [7])"atomno",&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = CONCAT62(local_90._2_6_,0x72);
  local_98 = 1;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 1;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x1c05;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[2],_OpenMD::Token,_true>(&local_68,(char (*) [2])0x2a1acc,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 2;
  local_90 = CONCAT53(local_90._3_5_,0x6f74);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 2;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x402;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[3],_OpenMD::Token,_true>(&local_68,(char (*) [3])0x2a6758,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_90 = CONCAT44(local_90._4_4_,0x6c6c61);
  local_98 = 3;
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 3;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x409;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[4],_OpenMD::Token,_true>(&local_68,(char (*) [4])0x2aabb5,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  local_98 = 4;
  local_90 = CONCAT35(local_90._5_3_,0x656e6f6e);
  local_b0._M_manager =
       std::any::
       _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
       ::_S_manage;
  local_b0._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_b0._M_storage._M_ptr = operator_new(0x20);
  *(long **)local_b0._M_storage._M_ptr = (long *)((long)local_b0._M_storage._M_ptr + 0x10);
  *(ulong *)((long)local_b0._M_storage._M_ptr + 0x10) = local_90;
  *(long *)((long)local_b0._M_storage._M_ptr + 0x18) =
       CONCAT62(uStack_86,CONCAT11(uStack_87,uStack_88));
  *(long *)((long)local_b0._M_storage._M_ptr + 8) = 4;
  local_98 = 0;
  local_90 = local_90 & 0xffffffffffffff00;
  local_80.tok = 0x40a;
  local_80.intValue = 0;
  local_80.value._M_storage._M_ptr = (void *)0x0;
  local_a0 = &local_90;
  local_30._M_any = paVar2;
  std::any::
  _Manager_external<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>
  ::_S_manage(_Op_clone,&local_b0,&local_30);
  std::
  pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_OpenMD::Token>
  ::pair<const_char_(&)[5],_OpenMD::Token,_true>(&local_68,(char (*) [5])0x2ae40b,&local_80);
  std::
  _Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
  ::_M_insert_unique<std::pair<std::__cxx11::string_const,OpenMD::Token>>
            ((_Rb_tree<std::__cxx11::string,std::pair<std::__cxx11::string_const,OpenMD::Token>,std::_Select1st<std::pair<std::__cxx11::string_const,OpenMD::Token>>,std::less<std::__cxx11::string>,std::allocator<std::pair<std::__cxx11::string_const,OpenMD::Token>>>
              *)this,&local_68);
  if (local_68.second.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_68.second.value._M_manager)(_Op_destroy,&local_68.second.value,(_Arg *)0x0);
    local_68.second.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_68.first._M_dataplus._M_p != paVar3) {
    operator_delete(local_68.first._M_dataplus._M_p,local_68.first.field_2._M_allocated_capacity + 1
                   );
  }
  if (local_80.value._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_80.value._M_manager)(_Op_destroy,paVar2,(_Arg *)0x0);
    local_80.value._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_b0._M_manager != (_func_void__Op_any_ptr__Arg_ptr *)0x0) {
    (*local_b0._M_manager)(_Op_destroy,&local_b0,(_Arg *)0x0);
    local_b0._M_manager = (_func_void__Op_any_ptr__Arg_ptr *)0x0;
  }
  if (local_a0 != &local_90) {
    operator_delete(local_a0,local_90 + 1);
  }
  return;
}

Assistant:

TokenMap::TokenMap() {
    tokenMap_.insert(TokenMapType::value_type(
        "define", Token(Token::define, std::string("define"))));
    tokenMap_.insert(TokenMapType::value_type(
        "select", Token(Token::select, std::string("select"))));
    // tokenMap_.insert(TokenMapType::value_type("selected",
    // Token(Token::selected, std::string("selected"))));

    // expressions
    tokenMap_.insert(TokenMapType::value_type(
        "(", Token(Token::leftparen, std::string("("))));
    tokenMap_.insert(TokenMapType::value_type(
        ")", Token(Token::rightparen, std::string(")"))));

    tokenMap_.insert(TokenMapType::value_type(
        "and", Token(Token::opAnd, std::string("and"))));
    tokenMap_.insert(
        TokenMapType::value_type("&", Token(Token::opAnd, std::string("and"))));
    tokenMap_.insert(TokenMapType::value_type(
        "&&", Token(Token::opAnd, std::string("and"))));

    tokenMap_.insert(
        TokenMapType::value_type("or", Token(Token::opOr, std::string("or"))));
    tokenMap_.insert(
        TokenMapType::value_type(",", Token(Token::opOr, std::string("or"))));
    tokenMap_.insert(
        TokenMapType::value_type("|", Token(Token::opOr, std::string("or"))));
    tokenMap_.insert(
        TokenMapType::value_type("||", Token(Token::opOr, std::string("or"))));

    tokenMap_.insert(TokenMapType::value_type(
        "not", Token(Token::opNot, std::string("not"))));
    tokenMap_.insert(
        TokenMapType::value_type("!", Token(Token::opNot, std::string("not"))));

    tokenMap_.insert(
        TokenMapType::value_type("<", Token(Token::opLT, std::string("<"))));
    tokenMap_.insert(
        TokenMapType::value_type("<=", Token(Token::opLE, std::string("<="))));
    tokenMap_.insert(
        TokenMapType::value_type(">=", Token(Token::opGE, std::string(">="))));
    tokenMap_.insert(
        TokenMapType::value_type(">", Token(Token::opGT, std::string(">"))));
    tokenMap_.insert(
        TokenMapType::value_type("==", Token(Token::opEQ, std::string("=="))));
    tokenMap_.insert(
        TokenMapType::value_type("!=", Token(Token::opNE, std::string("!="))));
    tokenMap_.insert(TokenMapType::value_type(
        "within", Token(Token::within, std::string("within"))));
    tokenMap_.insert(
        TokenMapType::value_type(".", Token(Token::dot, std::string("."))));
    tokenMap_.insert(TokenMapType::value_type(
        "mass", Token(Token::mass, std::string("mass"))));
    tokenMap_.insert(TokenMapType::value_type(
        "charge", Token(Token::charge, std::string("charge"))));
    tokenMap_.insert(TokenMapType::value_type(
        "hull", Token(Token::hull, std::string("hull"))));
    tokenMap_.insert(TokenMapType::value_type(
        "alphahull", Token(Token::alphahull, std::string("alphahull"))));
    tokenMap_.insert(
        TokenMapType::value_type("x", Token(Token::x, std::string("x"))));
    tokenMap_.insert(
        TokenMapType::value_type("y", Token(Token::y, std::string("y"))));
    tokenMap_.insert(
        TokenMapType::value_type("z", Token(Token::z, std::string("z"))));
    tokenMap_.insert(TokenMapType::value_type(
        "wrappedx", Token(Token::wrappedX, std::string("wrappedx"))));
    tokenMap_.insert(TokenMapType::value_type(
        "wrappedy", Token(Token::wrappedY, std::string("wrappedy"))));
    tokenMap_.insert(TokenMapType::value_type(
        "wrappedz", Token(Token::wrappedZ, std::string("wrappedz"))));
    tokenMap_.insert(TokenMapType::value_type(
        "atomno", Token(Token::atomno, std::string("atomno"))));
    tokenMap_.insert(
        TokenMapType::value_type("r", Token(Token::r, std::string("r"))));
    tokenMap_.insert(
        TokenMapType::value_type("to", Token(Token::to, std::string("to"))));

    tokenMap_.insert(
        TokenMapType::value_type("all", Token(Token::all, std::string("all"))));
    tokenMap_.insert(TokenMapType::value_type(
        "none", Token(Token::none, std::string("none"))));
  }